

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

bool glslang::isSameInterface(TIntermSymbol *symbol,TIntermSymbol *unitSymbol)

{
  EShLanguage EVar1;
  EShLanguage EVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  int iVar6;
  
  EVar1 = symbol->stage;
  EVar2 = unitSymbol->stage;
  if (EVar1 == EVar2) {
    iVar3 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    iVar6 = 3;
    iVar5 = 3;
    if ((*(char *)(CONCAT44(extraout_var,iVar3) + 8) == '\x10') &&
       (uVar4 = (*(uint *)(CONCAT44(extraout_var,iVar3) + 0x18) & 0x7f) - 3, uVar4 < 4)) {
      iVar5 = *(int *)(&DAT_0085c870 + (ulong)uVar4 * 4);
    }
    iVar3 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                      (unitSymbol);
    if ((*(char *)(CONCAT44(extraout_var_00,iVar3) + 8) == '\x10') &&
       (uVar4 = (*(uint *)(CONCAT44(extraout_var_00,iVar3) + 0x18) & 0x7f) - 3, uVar4 < 4)) {
      iVar6 = *(int *)(&DAT_0085c870 + (ulong)uVar4 * 4);
    }
    if (iVar5 == iVar6) {
      return true;
    }
  }
  iVar5 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol);
  if (((*(uint *)(CONCAT44(extraout_var_01,iVar5) + 8) & 0x7f) == 5) &&
     (iVar5 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])
                        (unitSymbol), (*(uint *)(CONCAT44(extraout_var_02,iVar5) + 8) & 0x7f) == 5))
  {
    return true;
  }
  iVar5 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol);
  if (((*(uint *)(CONCAT44(extraout_var_03,iVar5) + 8) & 0x7f) == 6) &&
     (iVar5 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])
                        (unitSymbol), (*(uint *)(CONCAT44(extraout_var_04,iVar5) + 8) & 0x7f) == 6))
  {
    return true;
  }
  if ((((int)EVar1 < (int)EVar2) &&
      (iVar5 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol),
      (*(uint *)(CONCAT44(extraout_var_05,iVar5) + 8) & 0x7f) == 4)) &&
     (iVar5 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])
                        (unitSymbol), (*(uint *)(CONCAT44(extraout_var_06,iVar5) + 8) & 0x7f) == 3))
  {
    return true;
  }
  if (((int)EVar2 < (int)EVar1) &&
     (iVar5 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol),
     (*(uint *)(CONCAT44(extraout_var_07,iVar5) + 8) & 0x7f) == 3)) {
    iVar5 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])
                      (unitSymbol);
    return (*(uint *)(CONCAT44(extraout_var_08,iVar5) + 8) & 0x7f) == 4;
  }
  return false;
}

Assistant:

static inline bool isSameInterface(TIntermSymbol* symbol, TIntermSymbol* unitSymbol) {
    EShLanguage stage = symbol->getStage();
    EShLanguage unitStage = unitSymbol->getStage();
    return // 1) same stage and same shader interface
        (stage == unitStage && symbol->getType().getShaderInterface() == unitSymbol->getType().getShaderInterface()) ||
        // 2) accross stages and both are uniform or buffer
        (symbol->getQualifier().storage == EvqUniform  && unitSymbol->getQualifier().storage == EvqUniform) ||
        (symbol->getQualifier().storage == EvqBuffer   && unitSymbol->getQualifier().storage == EvqBuffer) ||
        // 3) in/out matched across stage boundary
        (stage < unitStage && symbol->getQualifier().storage == EvqVaryingOut  && unitSymbol->getQualifier().storage == EvqVaryingIn) ||
        (unitStage < stage && symbol->getQualifier().storage == EvqVaryingIn && unitSymbol->getQualifier().storage == EvqVaryingOut);
}